

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::method(Parser *this,ptr<ObjectExpression> *descriptor,Scope scope)

{
  undefined4 scope_00;
  element_type *this_00;
  shared_ptr<Function> local_e0;
  undefined1 local_d0 [32];
  undefined1 local_b0 [8];
  ptr<Function> function;
  IdentifierList parameters;
  Token local_78;
  undefined1 local_40 [8];
  Identifier identifier;
  Scope scope_local;
  ptr<ObjectExpression> *descriptor_local;
  Parser *this_local;
  
  identifier.field_2._12_4_ = scope;
  consume(this);
  token(&local_78,this);
  std::__cxx11::string::string((string *)local_40,(string *)&local_78.lexeme);
  Token::~Token(&local_78);
  consume(this,Identifier,"identifier");
  consume(this,LeftParen,"\'(\'");
  identifierList_abi_cxx11_
            ((IdentifierList *)
             &function.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount,this);
  consume(this,RightParen,"\')\'");
  make<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_d0 + 0x10));
  statementBlock((Parser *)local_d0);
  make<Function,std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::shared_ptr<StatementBlock>>
            ((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_b0,(shared_ptr<StatementBlock> *)(local_d0 + 0x10));
  std::shared_ptr<StatementBlock>::~shared_ptr((shared_ptr<StatementBlock> *)local_d0);
  std::
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_d0 + 0x10));
  this_00 = std::__shared_ptr_access<ObjectExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ObjectExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)descriptor);
  scope_00 = identifier.field_2._12_4_;
  std::shared_ptr<Function>::shared_ptr(&local_e0,(shared_ptr<Function> *)local_b0);
  ObjectExpression::putFunction(this_00,(Identifier *)local_40,scope_00,&local_e0);
  std::shared_ptr<Function>::~shared_ptr(&local_e0);
  std::shared_ptr<Function>::~shared_ptr((shared_ptr<Function> *)local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&function.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Parser::method(ptr<ObjectExpression> &descriptor, Scope scope) {
    consume();

    Identifier identifier = token().lexeme;
    consume(TokenType::Identifier, "identifier");

    consume(TokenType::LeftParen, "'('");
    IdentifierList parameters = identifierList();
    consume(TokenType::RightParen, "')'");

    ptr<Function> function = make<Function>(make<IdentifierList>(parameters), statementBlock());
    descriptor -> putFunction(identifier, scope, function);
}